

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral.hpp
# Opt level: O2

string * __thiscall
viennamath::op_rt_integral<viennamath::rt_expression_interface<double>>::str_abi_cxx11_
          (string *__return_storage_ptr__,
          op_rt_integral<viennamath::rt_expression_interface<double>> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"rt_integral[");
  poVar1 = operator<<(poVar1,(rt_interval<viennamath::rt_expression_interface<double>_> *)this);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = operator<<(poVar1,(rt_variable<viennamath::rt_expression_interface<double>_> *)
                             (this + 0x10));
  std::operator<<(poVar1,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
      {
        std::stringstream ss;

        ss << "rt_integral[" << interval_ << ", " << integration_variable_ << "]";
        return ss.str();
      }